

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::generateLogon(Session *this)

{
  SessionState *this_00;
  pointer pcVar1;
  bool bVar2;
  SEQNUM data;
  undefined8 uVar3;
  Message logon;
  undefined1 local_1f8 [16];
  _Alloc_hider _Stack_1e8;
  char local_1d8 [16];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  field_metrics local_1a8;
  long *local_1a0;
  long local_198;
  long local_190 [2];
  Message local_180;
  
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,&MsgType_Logon,0x1cd89f);
  local_1f8._0_8_ = &PTR__FieldBase_001f55c8;
  local_1f8._8_4_ = 0x23;
  _Stack_1e8._M_p = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_1e8,local_1a0,local_198 + (long)local_1a0);
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8.m_length = 0;
  local_1a8.m_checksum = 0;
  local_1f8._0_8_ = &PTR__FieldBase_001f6658;
  local_1c8._M_p = (pointer)&local_1b8;
  newMessage(&local_180,this,(MsgType *)local_1f8);
  FieldBase::~FieldBase((FieldBase *)local_1f8);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  IntField::IntField((IntField *)local_1f8,0x62,0);
  local_1f8._0_8_ = &PTR__FieldBase_001f70c8;
  FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_1f8,true);
  FieldBase::~FieldBase((FieldBase *)local_1f8);
  FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)&(this->m_state).m_heartBtInt,true);
  if ((this->m_sessionID).m_isFIXT == true) {
    local_1f8._0_8_ = &PTR__FieldBase_001f55c8;
    local_1f8._8_4_ = 0x471;
    pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
    _Stack_1e8._M_p = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_1e8,pcVar1,
               pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length);
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_1a8.m_length = 0;
    local_1a8.m_checksum = 0;
    local_1f8._0_8_ = &PTR__FieldBase_001f7100;
    local_1c8._M_p = (pointer)&local_1b8;
    FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_1f8,true);
    FieldBase::~FieldBase((FieldBase *)local_1f8);
  }
  this_00 = &this->m_state;
  if (this->m_refreshOnLogon == true) {
    SessionState::refresh(this_00);
  }
  if (this->m_resetOnLogon == true) {
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001a3fc6;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)local_1f8,(_Any_data *)&this->m_timestamper)
    ;
    SessionState::reset(this_00,(UtcTimeStamp *)local_1f8);
  }
  bVar2 = shouldSendReset(this);
  if (bVar2) {
    BoolField::BoolField((BoolField *)local_1f8,0x8d,true);
    local_1f8._0_8_ = &PTR__FieldBase_001f6ed0;
    FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_1f8,true);
    FieldBase::~FieldBase((FieldBase *)local_1f8);
  }
  if (this->m_sendNextExpectedMsgSeqNum == true) {
    data = SessionState::getNextTargetMsgSeqNum(this_00);
    UInt64Field::UInt64Field((UInt64Field *)local_1f8,0x315,data);
    local_1f8._0_8_ = &PTR__FieldBase_001f6f40;
    FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_1f8,true);
    FieldBase::~FieldBase((FieldBase *)local_1f8);
  }
  fill(this,&local_180.m_header);
  if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)local_1f8,(_Any_data *)&this->m_timestamper)
    ;
    *(ulong *)&(this->m_state).m_lastReceivedTime.super_DateTime.m_date =
         CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
    (this->m_state).m_lastReceivedTime.super_DateTime.m_time = (int64_t)_Stack_1e8._M_p;
    (this->m_state).m_testRequest = 0;
    (this->m_state).m_sentLogon = true;
    sendRaw(this,&local_180,0);
    Message::~Message(&local_180);
    return;
  }
  std::__throw_bad_function_call();
LAB_001a3fc6:
  uVar3 = std::__throw_bad_function_call();
  FieldBase::~FieldBase((FieldBase *)local_1f8);
  Message::~Message(&local_180);
  _Unwind_Resume(uVar3);
}

Assistant:

void Session::generateLogon() {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  logon.setField(m_state.heartBtInt());
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_refreshOnLogon) {
    refresh();
  }
  if (m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }
  if (shouldSendReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(getExpectedTargetNum()));
  }

  fill(logon.getHeader());
  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);
  m_state.sentLogon(true);
  sendRaw(logon);
}